

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O1

size_t score(decks_t *result,size_t p1,size_t p2)

{
  _Elt_pointer puVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  _Elt_pointer puVar4;
  _Map_pointer ppuVar5;
  _Elt_pointer puVar6;
  long lVar7;
  _Elt_pointer puVar8;
  size_t winner;
  size_t local_20;
  size_t local_18;
  
  local_20 = p1;
  pmVar2 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)result,&local_20);
  if ((pmVar2->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (pmVar2->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    p2 = local_20;
  }
  local_18 = p2;
  pmVar2 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)result,&local_18);
  puVar1 = (pmVar2->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  puVar4 = (pmVar2->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar4 == puVar1) {
    sVar3 = 0;
  }
  else {
    puVar6 = (pmVar2->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppuVar5 = (pmVar2->cards).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar7 = 1;
    sVar3 = 0;
    do {
      puVar8 = puVar4;
      if (puVar4 == puVar6) {
        puVar8 = ppuVar5[-1] + 0x40;
        puVar6 = ppuVar5[-1];
        ppuVar5 = ppuVar5 + -1;
        puVar4 = puVar6 + 0x40;
      }
      sVar3 = sVar3 + puVar8[-1] * lVar7;
      puVar4 = puVar4 + -1;
      lVar7 = lVar7 + 1;
    } while (puVar4 != puVar1);
  }
  return sVar3;
}

Assistant:

size_t score(decks_t result, size_t p1, size_t p2) {
  auto winner = result.at(p1).cards.empty() ? p2 : p1;
  const auto& winner_deck = result.at(winner).cards;

  auto i = 1;
  return std::accumulate(winner_deck.crbegin(), winner_deck.crend(), uint64_t{0}, [&i](auto a, auto v){
    return a + v * (i++);
  });
}